

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgclient.c
# Opt level: O1

int mg_bolt_init(mg_session *session,mg_session_params *params)

{
  int iVar1;
  mg_message *in_RAX;
  mg_message *response;
  mg_message *local_18;
  
  local_18 = in_RAX;
  if (session->version == 1) {
    iVar1 = mg_bolt_init_v1(session,params);
  }
  else {
    iVar1 = mg_bolt_init_v4(session,params);
  }
  if (((iVar1 == 0) && (iVar1 = mg_session_receive_message(session), iVar1 == 0)) &&
     (iVar1 = mg_session_read_bolt_message(session,&local_18), iVar1 == 0)) {
    if (local_18->type == MG_MESSAGE_TYPE_SUCCESS) {
      iVar1 = 0;
    }
    else if (local_18->type == MG_MESSAGE_TYPE_FAILURE) {
      iVar1 = handle_failure_message(session,(local_18->field_1).failure_v);
    }
    else {
      mg_session_set_error(session,"unexpected message type");
      iVar1 = -10;
    }
    mg_message_destroy_ca(local_18,session->decoder_allocator);
  }
  return iVar1;
}

Assistant:

static int mg_bolt_init(mg_session *session, const mg_session_params *params) {
  int status = session->version == 1 ? mg_bolt_init_v1(session, params)
                                     : mg_bolt_init_v4(session, params);
  if (status != 0) {
    return status;
  }

  MG_RETURN_IF_FAILED(mg_session_receive_message(session));

  mg_message *response;
  MG_RETURN_IF_FAILED(mg_session_read_bolt_message(session, &response));

  if (response->type == MG_MESSAGE_TYPE_SUCCESS) {
    status = 0;
  } else if (response->type == MG_MESSAGE_TYPE_FAILURE) {
    status = handle_failure_message(session, response->failure_v);
  } else {
    status = MG_ERROR_PROTOCOL_VIOLATION;
    mg_session_set_error(session, "unexpected message type");
  }

  mg_message_destroy_ca(response, session->decoder_allocator);
  return status;
}